

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.h
# Opt level: O2

void __thiscall
Js::DynamicTypeHandler::ShareTypeHandler(DynamicTypeHandler *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  
  iVar3 = (*this->_vptr_DynamicTypeHandler[5])();
  if (iVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                ,0x16e,"(IsSharable())","IsSharable()");
    if (!bVar2) goto LAB_00c3ecfc;
    *puVar4 = 0;
  }
  if ((this->flags & 8) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                ,0x16f,"(GetMayBecomeShared())","GetMayBecomeShared()");
    if (!bVar2) {
LAB_00c3ecfc:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  LockTypeHandler(this);
  if ((this->flags & 0x10) == 0) {
    (*this->_vptr_DynamicTypeHandler[0x57])(this,scriptContext);
  }
  SetFlags(this,'\x10');
  return;
}

Assistant:

void ShareTypeHandler(ScriptContext* scriptContext)
        {
            Assert(IsSharable());
            Assert(GetMayBecomeShared());
            LockTypeHandler();
#if ENABLE_FIXED_FIELDS
            if ((GetFlags() & IsSharedFlag) == 0)
            {
                DoShareTypeHandler(scriptContext);
            }
#endif
            SetFlags(IsSharedFlag);
        }